

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrIncr.c
# Opt level: O1

int IPdr_ManCheckCubeReduce(Pdr_Man_t *p,Vec_Ptr_t *vClauses,Pdr_Set_t *pCube,int nConfLimit)

{
  sat_solver *s;
  Vec_Ptr_t *pVVar1;
  int *piVar2;
  Pdr_Set_t *p_00;
  int iVar3;
  int iVar4;
  int iVar5;
  uint *puVar6;
  lit *begin;
  undefined4 extraout_var;
  Vec_Int_t *p_01;
  undefined8 uVar7;
  ulong uVar8;
  void *__dest;
  void *__s;
  ulong uVar9;
  void **ppvVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  int Lit;
  timespec ts;
  int local_7c;
  undefined8 local_78;
  timespec local_70;
  int local_5c;
  ulong local_58;
  long local_50;
  uint *local_48;
  long local_40;
  Pdr_Man_t *local_38;
  
  iVar5 = 3;
  iVar3 = clock_gettime(3,&local_70);
  if (iVar3 < 0) {
    lVar13 = -1;
  }
  else {
    lVar13 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
  }
  if (1 < p->vSolvers->nSize) {
    s = (sat_solver *)p->vSolvers->pArray[1];
    if (pCube == (Pdr_Set_t *)0x0) {
      iVar3 = p->iOutCur;
      if (((long)iVar3 < 0) || (pVVar1 = p->pAig->vCos, pVVar1->nSize <= iVar3)) goto LAB_008f5954;
      iVar3 = Pdr_ObjSatVar(p,1,2,(Aig_Obj_t *)pVVar1->pArray[iVar3]);
      if (iVar3 < 0) {
LAB_008f589a:
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12e,"int Abc_Var2Lit(int, int)");
      }
      local_7c = iVar3 * 2;
      iVar3 = sat_solver_addclause(s,&local_7c,(lit *)&local_78);
      if (iVar3 != 1) {
        __assert_fail("RetValue == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrIncr.c"
                      ,0x385,
                      "int IPdr_ManCheckCubeReduce(Pdr_Man_t *, Vec_Ptr_t *, Pdr_Set_t *, int)");
      }
      uVar11 = vClauses->nSize;
      puVar6 = (uint *)malloc(0x10);
      uVar12 = 0x10;
      if (0xe < uVar11 - 1) {
        uVar12 = uVar11;
      }
      puVar6[1] = 0;
      *puVar6 = uVar12;
      local_58 = (ulong)uVar11;
      if (uVar12 == 0) {
        begin = (lit *)0x0;
      }
      else {
        begin = (lit *)malloc((long)(int)uVar12 << 2);
      }
      uVar11 = (uint)local_58;
      *(lit **)(puVar6 + 2) = begin;
      puVar6[1] = uVar11;
      local_5c = nConfLimit;
      if (begin != (lit *)0x0) {
        memset(begin,0,(long)(int)uVar11 * 4);
      }
      iVar5 = 1;
      local_50 = (long)(int)uVar11;
      local_48 = puVar6;
      local_40 = lVar13;
      iVar3 = Pdr_ManFreeVar(p,1);
      local_78 = CONCAT44(extraout_var,iVar3);
      if (1 < vClauses->nSize) {
        do {
          Pdr_ManFreeVar(p,1);
          iVar5 = iVar5 + 1;
        } while (iVar5 < vClauses->nSize);
      }
      local_38 = p;
      if (0 < vClauses->nSize) {
        uVar8 = 0;
        uVar9 = local_58 & 0xffffffff;
        if ((int)local_58 < 1) {
          uVar9 = 0;
        }
        iVar3 = (int)local_78;
        iVar5 = iVar3 * 2;
        do {
          p_01 = Pdr_ManCubeToLits(local_38,1,(Pdr_Set_t *)vClauses->pArray[uVar8],1,0);
          if (iVar3 + (int)uVar8 < 0) goto LAB_008f589a;
          local_7c = iVar5 + 1;
          Vec_IntPush(p_01,local_7c);
          iVar4 = sat_solver_addclause(s,p_01->pArray,p_01->pArray + p_01->nSize);
          if (iVar4 != 1) {
            __assert_fail("RetValue == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrIncr.c"
                          ,0x392,
                          "int IPdr_ManCheckCubeReduce(Pdr_Man_t *, Vec_Ptr_t *, Pdr_Set_t *, int)")
            ;
          }
          if (uVar9 == uVar8) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          begin[uVar8] = iVar5;
          uVar8 = uVar8 + 1;
          iVar5 = iVar5 + 2;
        } while ((long)uVar8 < (long)vClauses->nSize);
      }
      if ((s->qtail != s->qhead) && (iVar3 = sat_solver_simplify(s), iVar3 == 0)) {
        __assert_fail("RetValue != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                      ,0x102,"void sat_solver_compress(sat_solver *)");
      }
      iVar3 = sat_solver_solve(s,begin,begin + local_50,(long)local_5c,0,0,0);
      lVar13 = local_40;
      puVar6 = local_48;
      if (*(void **)(local_48 + 2) != (void *)0x0) {
        free(*(void **)(local_48 + 2));
        puVar6[2] = 0;
        puVar6[3] = 0;
      }
      free(puVar6);
      iVar5 = (int)puVar6;
      uVar7 = local_78;
      if (iVar3 == 0) {
        return -1;
      }
    }
    else {
      iVar3 = 1;
      uVar7 = 0;
    }
    if (iVar3 == -1) {
      piVar2 = (s->conf_final).ptr;
      uVar11 = (s->conf_final).size;
      local_78 = uVar7;
      Abc_Print(iVar5,"UNSAT at the last frame. nCores = %d (out of %d).",(ulong)uVar11,
                (ulong)(uint)vClauses->nSize);
      iVar5 = 3;
      iVar3 = clock_gettime(3,&local_70);
      if (iVar3 < 0) {
        lVar15 = -1;
      }
      else {
        lVar15 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
      }
      Abc_Print(iVar5,"%s =","    Time");
      Abc_Print(iVar5,"%9.2f sec\n",(double)(lVar15 - lVar13) / 1000000.0);
      iVar3 = vClauses->nSize;
      uVar8 = (ulong)iVar3;
      if ((long)vClauses->nCap == 0) {
        __dest = (void *)0x0;
      }
      else {
        __dest = malloc((long)vClauses->nCap << 3);
      }
      memcpy(__dest,vClauses->pArray,uVar8 * 8);
      iVar5 = ((iVar3 >> 5) + 1) - (uint)((uVar8 & 0x1f) == 0);
      if (iVar5 == 0) {
        __s = (void *)0x0;
      }
      else {
        __s = malloc((long)iVar5 * 4);
      }
      memset(__s,0,(long)iVar5 << 2);
      vClauses->nSize = 0;
      if (0 < (int)uVar11) {
        uVar9 = 0;
        do {
          uVar12 = piVar2[uVar9];
          if ((int)uVar12 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x12f,"int Abc_Lit2Var(int)");
          }
          uVar12 = (uVar12 >> 1) - (int)local_78;
          if (((int)uVar12 < 0) || (iVar5 * 0x20 <= (int)uVar12)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                          ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
          }
          puVar6 = (uint *)((long)__s + (ulong)(uVar12 >> 5) * 4);
          *puVar6 = *puVar6 | 1 << ((byte)uVar12 & 0x1f);
          uVar9 = uVar9 + 1;
        } while (uVar11 != uVar9);
      }
      if (0 < iVar3) {
        uVar14 = 0;
        uVar9 = (ulong)(uint)(iVar5 * 0x20);
        if (iVar5 * 0x20 < 1) {
          uVar9 = uVar14;
        }
        do {
          if (uVar9 == uVar14) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                          ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
          }
          p_00 = *(Pdr_Set_t **)((long)__dest + uVar14 * 8);
          if ((*(uint *)((long)__s + (uVar14 >> 5 & 0x7ffffff) * 4) >> ((uint)uVar14 & 0x1f) & 1) ==
              0) {
            Pdr_SetDeref(p_00);
          }
          else {
            uVar11 = vClauses->nCap;
            if (vClauses->nSize == uVar11) {
              if ((int)uVar11 < 0x10) {
                if (vClauses->pArray == (void **)0x0) {
                  ppvVar10 = (void **)malloc(0x80);
                }
                else {
                  ppvVar10 = (void **)realloc(vClauses->pArray,0x80);
                }
                iVar3 = 0x10;
              }
              else {
                iVar3 = uVar11 * 2;
                if (iVar3 <= (int)uVar11) goto LAB_008f5841;
                if (vClauses->pArray == (void **)0x0) {
                  ppvVar10 = (void **)malloc((ulong)uVar11 << 4);
                }
                else {
                  ppvVar10 = (void **)realloc(vClauses->pArray,(ulong)uVar11 << 4);
                }
              }
              vClauses->pArray = ppvVar10;
              vClauses->nCap = iVar3;
            }
LAB_008f5841:
            iVar3 = vClauses->nSize;
            vClauses->nSize = iVar3 + 1;
            vClauses->pArray[iVar3] = p_00;
          }
          uVar14 = uVar14 + 1;
        } while (uVar8 != uVar14);
      }
      if (__dest != (void *)0x0) {
        free(__dest);
      }
      iVar3 = 1;
      if (__s != (void *)0x0) {
        free(__s);
      }
    }
    else {
      iVar3 = 0;
      Abc_Print(iVar5,"SAT at the last frame.");
      iVar4 = 3;
      iVar5 = clock_gettime(3,&local_70);
      if (iVar5 < 0) {
        lVar15 = -1;
      }
      else {
        lVar15 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
      }
      Abc_Print(iVar4,"%s =","    Time");
      Abc_Print(iVar4,"%9.2f sec\n",(double)(lVar15 - lVar13) / 1000000.0);
    }
    return iVar3;
  }
LAB_008f5954:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

int IPdr_ManCheckCubeReduce( Pdr_Man_t * p, Vec_Ptr_t * vClauses, Pdr_Set_t * pCube, int nConfLimit )
{ 
    sat_solver * pSat;
    Vec_Int_t * vLits, * vLitsA;
    int Lit, RetValue = l_True;
    int i;
    Pdr_Set_t * pCla;
    int iActVar = 0;
    abctime clk = Abc_Clock();

    pSat = Pdr_ManSolver( p, 1 );

    if ( pCube == NULL ) // solve the property
    {
        Lit = Abc_Var2Lit( Pdr_ObjSatVar(p, 1, 2, Aig_ManCo(p->pAig, p->iOutCur)), 0 ); // pos literal (property fails)
        RetValue = sat_solver_addclause( pSat, &Lit, &Lit+1 );
        assert( RetValue == 1 );

        vLitsA = Vec_IntStart( Vec_PtrSize( vClauses ) );
        iActVar = Pdr_ManFreeVar( p, 1 );
        for ( i = 1; i < Vec_PtrSize( vClauses ); ++i )
            Pdr_ManFreeVar( p, 1 );
        Vec_PtrForEachEntry( Pdr_Set_t *, vClauses, pCla, i )
        {
            vLits = Pdr_ManCubeToLits( p, 1, pCla, 1, 0 );
            Lit = Abc_Var2Lit( iActVar + i, 1 );
            Vec_IntPush( vLits, Lit );

            RetValue = sat_solver_addclause( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits) );
            assert( RetValue == 1 );
            Vec_IntWriteEntry( vLitsA, i, Abc_Var2Lit( iActVar + i, 0 )  );
        }
        sat_solver_compress( pSat );

        // solve 
        RetValue = sat_solver_solve( pSat, Vec_IntArray(vLitsA), Vec_IntArray(vLitsA) + Vec_IntSize(vLitsA), nConfLimit, 0, 0, 0 );
        Vec_IntFree( vLitsA );

        if ( RetValue == l_Undef )
            return -1;
    }

    assert( RetValue != l_Undef );
    if ( RetValue == l_False ) // UNSAT
    {
        int ncorelits, *pcorelits;
        Vec_Ptr_t * vTemp = NULL;
        Vec_Bit_t * vMark = NULL;

        ncorelits = sat_solver_final(pSat, &pcorelits);
        Abc_Print( 1, "UNSAT at the last frame. nCores = %d (out of %d).", ncorelits, Vec_PtrSize( vClauses ) );
        Abc_PrintTime( 1, "    Time", Abc_Clock() - clk );

        vTemp = Vec_PtrDup( vClauses );
        vMark = Vec_BitStart( Vec_PtrSize( vClauses) );
        Vec_PtrClear( vClauses );
        for ( i = 0; i < ncorelits; ++i )
        {
            //Abc_Print( 1, "Core[%d] = lit(%d) = var(%d) = %d-th set\n", i, pcorelits[i], Abc_Lit2Var(pcorelits[i]), Abc_Lit2Var(pcorelits[i]) - iActVar );
            Vec_BitWriteEntry( vMark, Abc_Lit2Var( pcorelits[i] ) - iActVar, 1 );
        }
        
        Vec_PtrForEachEntry( Pdr_Set_t *, vTemp, pCla, i )
        {
            if ( Vec_BitEntry( vMark, i ) )
            { 
                Vec_PtrPush( vClauses, pCla );
                continue;
            }
            Pdr_SetDeref( pCla );
        }

        Vec_PtrFree( vTemp );
        Vec_BitFree( vMark );
        RetValue = 1;
    }
    else // SAT
    {
        Abc_Print( 1, "SAT at the last frame." );
        Abc_PrintTime( 1, "    Time", Abc_Clock() - clk );
        RetValue = 0;
    }

    return RetValue;
}